

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::registry_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::registry_entry,_std::allocator<setup::registry_entry>_> *result,
          enum_type entry_type)

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  flags<setup::info::entry_types_Enum_,_21UL> *in_RDI;
  vector<setup::registry_entry,_std::allocator<setup::registry_entry>_> *in_R8;
  registry_entry entry;
  size_t i_1;
  size_t i;
  undefined8 in_stack_fffffffffffffe00;
  enum_type flag;
  ini_entry *this_00;
  size_type in_stack_fffffffffffffe18;
  vector<setup::registry_entry,_std::allocator<setup::registry_entry>_> *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  registry_entry *in_stack_fffffffffffffec0;
  ulong local_48;
  ulong local_40;
  
  flag = (enum_type)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  std::vector<setup::registry_entry,_std::allocator<setup::registry_entry>_>::clear
            ((vector<setup::registry_entry,_std::allocator<setup::registry_entry>_> *)0x17ab81);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&(in_RDI,flag);
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x17abaa);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      this_00 = (ini_entry *)&stack0xfffffffffffffe20;
      registry_entry::registry_entry((registry_entry *)in_stack_fffffffffffffe30);
      registry_entry::load
                (in_stack_fffffffffffffec0,(istream *)in_stack_fffffffffffffeb8,
                 (info *)in_stack_fffffffffffffeb0);
      registry_entry::~registry_entry(this_00);
    }
  }
  else {
    std::vector<setup::registry_entry,_std::allocator<setup::registry_entry>_>::resize
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::registry_entry,_std::allocator<setup::registry_entry>_>::operator[]
                (in_R8,local_40);
      registry_entry::load
                (in_stack_fffffffffffffec0,(istream *)in_stack_fffffffffffffeb8,
                 (info *)in_stack_fffffffffffffeb0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}